

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damerau_levenshtein.cpp
# Opt level: O2

void duckdb::DamerauLevenshteinFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  long *plVar4;
  reference vector;
  reference vector_00;
  long lVar5;
  idx_t iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  idx_t iVar10;
  idx_t i;
  idx_t iVar11;
  ulong uVar12;
  data_ptr_t pdVar13;
  undefined8 in_R8;
  ValidityMask *in_R9;
  ulong uVar14;
  data_ptr_t pdVar15;
  idx_t count;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  idx_t i_1;
  data_ptr_t pdVar19;
  bool bVar20;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t left_07;
  string_t left_08;
  string_t left_09;
  string_t left_10;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  string_t right_07;
  string_t right_08;
  string_t right_09;
  string_t right_10;
  idx_t in_stack_ffffffffffffff08;
  data_ptr_t pdVar21;
  data_ptr_t pdVar22;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat ldata;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    plVar4 = (long *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      left.value.pointer.ptr = (char *)*(undefined8 *)vector_00->data;
      left.value._0_8_ = *(undefined8 *)(vector->data + 8);
      right.value.pointer.ptr = (char *)in_R8;
      right.value._0_8_ = *(undefined8 *)(vector_00->data + 8);
      lVar5 = BinaryLambdaWrapper::
              Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                        (*(Vector **)vector->data,left,right,in_R9,in_stack_ffffffffffffff08);
      *plVar4 = lVar5;
      return;
    }
  }
  else {
    count = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar19 = vector->data;
      pdVar13 = vector_00->data;
      puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar22 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,&vector->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          pdVar19 = pdVar19 + 8;
          for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
            left_05.value.pointer.ptr = (char *)*(undefined8 *)pdVar13;
            left_05.value._0_8_ = *(undefined8 *)pdVar19;
            right_05.value.pointer.ptr = (char *)in_R8;
            right_05.value._0_8_ = *(undefined8 *)(pdVar13 + 8);
            lVar5 = BinaryLambdaWrapper::
                    Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                              (*(Vector **)(pdVar19 + -8),left_05,right_05,in_R9,(idx_t)pdVar22);
            *(long *)(pdVar22 + iVar11 * 8) = lVar5;
            pdVar19 = pdVar19 + 0x10;
          }
          return;
        }
        uVar9 = 0;
        uVar14 = 0;
        do {
          if (uVar9 == count + 0x3f >> 6) {
            return;
          }
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar12 = uVar14 + 0x40;
            if (count <= uVar14 + 0x40) {
              uVar12 = count;
            }
LAB_01e7e3a5:
            pdVar15 = pdVar19 + uVar14 * 0x10 + 8;
            for (; uVar7 = uVar14, pdVar21 = pdVar22, uVar14 < uVar12; uVar14 = uVar14 + 1) {
              left_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar13;
              left_00.value._0_8_ = *(undefined8 *)pdVar15;
              right_00.value.pointer.ptr = (char *)in_R8;
              right_00.value._0_8_ = *(undefined8 *)(pdVar13 + 8);
              lVar5 = BinaryLambdaWrapper::
                      Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                (*(Vector **)(pdVar15 + -8),left_00,right_00,in_R9,(idx_t)pdVar22);
              *(long *)(pdVar22 + uVar14 * 8) = lVar5;
              pdVar15 = pdVar15 + 0x10;
            }
          }
          else {
            uVar17 = puVar3[uVar9];
            uVar12 = uVar14 + 0x40;
            if (count <= uVar14 + 0x40) {
              uVar12 = count;
            }
            if (uVar17 == 0xffffffffffffffff) goto LAB_01e7e3a5;
            uVar7 = uVar12;
            pdVar21 = pdVar22;
            if (uVar17 != 0) {
              pdVar15 = pdVar19 + uVar14 * 0x10 + 8;
              for (uVar16 = 0; uVar7 = uVar14 + uVar16, uVar14 + uVar16 < uVar12;
                  uVar16 = uVar16 + 1) {
                if ((uVar17 >> (uVar16 & 0x3f) & 1) != 0) {
                  left_01.value.pointer.ptr = (char *)*(undefined8 *)pdVar13;
                  left_01.value._0_8_ = *(undefined8 *)pdVar15;
                  right_01.value.pointer.ptr = (char *)in_R8;
                  right_01.value._0_8_ = *(undefined8 *)(pdVar13 + 8);
                  lVar5 = BinaryLambdaWrapper::
                          Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                    (*(Vector **)(pdVar15 + -8),left_01,right_01,in_R9,
                                     (idx_t)pdVar21);
                  *(long *)(pdVar22 + uVar16 * 8 + uVar14 * 8) = lVar5;
                }
                pdVar15 = pdVar15 + 0x10;
              }
            }
          }
          uVar9 = uVar9 + 1;
          uVar14 = uVar7;
          pdVar22 = pdVar21;
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar19 = vector->data;
          pdVar13 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar22 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,&vector->validity);
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,count);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            lVar5 = 0;
            while (bVar20 = count != 0, count = count - 1, bVar20) {
              left_10.value.pointer.ptr = (char *)*(undefined8 *)(pdVar13 + lVar5 * 2);
              left_10.value._0_8_ = *(undefined8 *)(pdVar19 + lVar5 * 2 + 8);
              right_10.value.pointer.ptr = (char *)in_R8;
              right_10.value._0_8_ = *(undefined8 *)(pdVar13 + lVar5 * 2 + 8);
              lVar8 = BinaryLambdaWrapper::
                      Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                (*(Vector **)(pdVar19 + lVar5 * 2),left_10,right_10,in_R9,
                                 (idx_t)pdVar22);
              *(long *)(pdVar22 + lVar5) = lVar8;
              lVar5 = lVar5 + 8;
            }
          }
          else {
            uVar14 = 0;
            for (uVar9 = 0; uVar9 != count + 0x3f >> 6; uVar9 = uVar9 + 1) {
              puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar12 = uVar14 + 0x40;
                if (count <= uVar14 + 0x40) {
                  uVar12 = count;
                }
LAB_01e7e7f5:
                uVar17 = uVar14 << 4 | 8;
                for (; uVar7 = uVar14, pdVar15 = pdVar22, uVar14 < uVar12; uVar14 = uVar14 + 1) {
                  left_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar13 + (uVar17 - 8));
                  left_06.value._0_8_ = *(undefined8 *)(pdVar19 + uVar17);
                  right_06.value.pointer.ptr = (char *)in_R8;
                  right_06.value._0_8_ = *(undefined8 *)(pdVar13 + uVar17);
                  lVar5 = BinaryLambdaWrapper::
                          Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                    (*(Vector **)(pdVar19 + (uVar17 - 8)),left_06,right_06,in_R9,
                                     (idx_t)pdVar22);
                  *(long *)(pdVar22 + uVar14 * 8) = lVar5;
                  uVar17 = uVar17 + 0x10;
                }
              }
              else {
                uVar17 = puVar3[uVar9];
                uVar12 = uVar14 + 0x40;
                if (count <= uVar14 + 0x40) {
                  uVar12 = count;
                }
                if (uVar17 == 0xffffffffffffffff) goto LAB_01e7e7f5;
                uVar7 = uVar12;
                pdVar15 = pdVar22;
                if (uVar17 != 0) {
                  uVar18 = uVar14 << 4 | 8;
                  for (uVar16 = 0; uVar7 = uVar14 + uVar16, uVar14 + uVar16 < uVar12;
                      uVar16 = uVar16 + 1) {
                    if ((uVar17 >> (uVar16 & 0x3f) & 1) != 0) {
                      left_07.value.pointer.ptr = (char *)*(undefined8 *)(pdVar13 + (uVar18 - 8));
                      left_07.value._0_8_ = *(undefined8 *)(pdVar19 + uVar18);
                      right_07.value.pointer.ptr = (char *)in_R8;
                      right_07.value._0_8_ = *(undefined8 *)(pdVar13 + uVar18);
                      lVar5 = BinaryLambdaWrapper::
                              Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                        (*(Vector **)(pdVar19 + (uVar18 - 8)),left_07,right_07,in_R9
                                         ,(idx_t)pdVar15);
                      *(long *)(pdVar22 + uVar16 * 8 + uVar14 * 8) = lVar5;
                    }
                    uVar18 = uVar18 + 0x10;
                  }
                }
              }
              uVar14 = uVar7;
              pdVar22 = pdVar15;
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,count,&ldata);
          Vector::ToUnifiedFormat(vector_00,count,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar19 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
              iVar6 = iVar11;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar6 = (idx_t)(ldata.sel)->sel_vector[iVar11];
              }
              iVar10 = iVar11;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar10 = (idx_t)(local_c0.sel)->sel_vector[iVar11];
              }
              left_02.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + iVar10 * 0x10);
              left_02.value._0_8_ = *(undefined8 *)(ldata.data + iVar6 * 0x10 + 8);
              right_02.value.pointer.ptr = (char *)in_R8;
              right_02.value._0_8_ = *(undefined8 *)(local_c0.data + iVar10 * 0x10 + 8);
              lVar5 = BinaryLambdaWrapper::
                      Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                (*(Vector **)(ldata.data + iVar6 * 0x10),left_02,right_02,in_R9,
                                 (idx_t)pdVar19);
              *(long *)(pdVar19 + iVar11 * 8) = lVar5;
            }
          }
          else {
            for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
              iVar6 = iVar11;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar6 = (idx_t)(ldata.sel)->sel_vector[iVar11];
              }
              iVar10 = iVar11;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar10 = (idx_t)(local_c0.sel)->sel_vector[iVar11];
              }
              if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar10 >> 6] >> (iVar10 & 0x3f) & 1) != 0)))) {
                left_08.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + iVar10 * 0x10);
                left_08.value._0_8_ = *(undefined8 *)(ldata.data + iVar6 * 0x10 + 8);
                right_08.value.pointer.ptr = (char *)in_R8;
                right_08.value._0_8_ = *(undefined8 *)(local_c0.data + iVar10 * 0x10 + 8);
                lVar5 = BinaryLambdaWrapper::
                        Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                  (*(Vector **)(ldata.data + iVar6 * 0x10),left_08,right_08,in_R9,
                                   (idx_t)pdVar19);
                *(long *)(pdVar19 + iVar11 * 8) = lVar5;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
              }
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      pdVar19 = vector->data;
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar13 = vector_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar22 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::SetValidity(result,&vector_00->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          pdVar13 = pdVar13 + 8;
          for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
            left_09.value.pointer.ptr = (char *)*(undefined8 *)(pdVar13 + -8);
            left_09.value._0_8_ = *(undefined8 *)(pdVar19 + 8);
            right_09.value.pointer.ptr = (char *)in_R8;
            right_09.value._0_8_ = *(undefined8 *)pdVar13;
            lVar5 = BinaryLambdaWrapper::
                    Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                              (*(Vector **)pdVar19,left_09,right_09,in_R9,(idx_t)pdVar22);
            *(long *)(pdVar22 + iVar11 * 8) = lVar5;
            pdVar13 = pdVar13 + 0x10;
          }
          return;
        }
        uVar9 = 0;
        uVar14 = 0;
        do {
          if (uVar9 == count + 0x3f >> 6) {
            return;
          }
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar12 = uVar14 + 0x40;
            if (count <= uVar14 + 0x40) {
              uVar12 = count;
            }
LAB_01e7e637:
            pdVar15 = pdVar13 + uVar14 * 0x10 + 8;
            for (; uVar7 = uVar14, pdVar21 = pdVar22, uVar14 < uVar12; uVar14 = uVar14 + 1) {
              left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar15 + -8);
              left_03.value._0_8_ = *(undefined8 *)(pdVar19 + 8);
              right_03.value.pointer.ptr = (char *)in_R8;
              right_03.value._0_8_ = *(undefined8 *)pdVar15;
              lVar5 = BinaryLambdaWrapper::
                      Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                (*(Vector **)pdVar19,left_03,right_03,in_R9,(idx_t)pdVar22);
              *(long *)(pdVar22 + uVar14 * 8) = lVar5;
              pdVar15 = pdVar15 + 0x10;
            }
          }
          else {
            uVar17 = puVar3[uVar9];
            uVar12 = uVar14 + 0x40;
            if (count <= uVar14 + 0x40) {
              uVar12 = count;
            }
            if (uVar17 == 0xffffffffffffffff) goto LAB_01e7e637;
            uVar7 = uVar12;
            pdVar21 = pdVar22;
            if (uVar17 != 0) {
              pdVar15 = pdVar13 + uVar14 * 0x10 + 8;
              for (uVar16 = 0; uVar7 = uVar14 + uVar16, uVar14 + uVar16 < uVar12;
                  uVar16 = uVar16 + 1) {
                if ((uVar17 >> (uVar16 & 0x3f) & 1) != 0) {
                  left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar15 + -8);
                  left_04.value._0_8_ = *(undefined8 *)(pdVar19 + 8);
                  right_04.value.pointer.ptr = (char *)in_R8;
                  right_04.value._0_8_ = *(undefined8 *)pdVar15;
                  lVar5 = BinaryLambdaWrapper::
                          Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                    (*(Vector **)pdVar19,left_04,right_04,in_R9,(idx_t)pdVar21);
                  *(long *)(pdVar22 + uVar16 * 8 + uVar14 * 8) = lVar5;
                }
                pdVar15 = pdVar15 + 0x10;
              }
            }
          }
          uVar9 = uVar9 + 1;
          uVar14 = uVar7;
          pdVar22 = pdVar21;
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DamerauLevenshteinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &source_vec = args.data[0];
	auto &target_vec = args.data[1];

	BinaryExecutor::Execute<string_t, string_t, int64_t>(
	    source_vec, target_vec, result, args.size(),
	    [&](string_t source, string_t target) { return DamerauLevenshteinScalarFunction(result, source, target); });
}